

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

int equalkey(TValue *k1,Node *n2)

{
  Node *n2_local;
  TValue *k1_local;
  
  if (k1->tt_ == (n2->i_key).nk.tt_) {
    switch(k1->tt_ & 0x7f) {
    case 0:
      k1_local._4_4_ = 1;
      break;
    case 1:
      if (k1->tt_ != 1) {
        __assert_fail("((((k1))->tt_) == (1))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x8c,"int equalkey(const TValue *, const Node *)");
      }
      k1_local._4_4_ = (uint)((k1->value_).b == *(int *)&n2->i_key);
      break;
    case 2:
    case 0x46:
      if (k1->tt_ != 2) {
        __assert_fail("((((k1))->tt_) == (2))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x93,"int equalkey(const TValue *, const Node *)");
      }
      k1_local._4_4_ = (uint)((k1->value_).gc == (n2->i_key).nk.value_.gc);
      break;
    case 3:
      if (k1->tt_ != 3) {
        __assert_fail("((((k1))->tt_) == (((3) | ((0) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x90,"int equalkey(const TValue *, const Node *)");
      }
      k1_local._4_4_ = (uint)((k1->value_).n == *(double *)&n2->i_key);
      break;
    default:
      if ((k1->tt_ & 0x8000) == 0) {
        __assert_fail("(((k1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x99,"int equalkey(const TValue *, const Node *)");
      }
      k1_local._4_4_ = (uint)((k1->value_).gc == (n2->i_key).nk.value_.gc);
      break;
    case 0x13:
      if (k1->tt_ != 0x13) {
        __assert_fail("((((k1))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x8e,"int equalkey(const TValue *, const Node *)");
      }
      k1_local._4_4_ = (uint)((k1->value_).gc == (n2->i_key).nk.value_.gc);
      break;
    case 0x14:
      if ((k1->tt_ & 0xf) != 4) {
        __assert_fail("(((((((k1))->tt_)) & 0x0F)) == (4))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x97,"int equalkey(const TValue *, const Node *)");
      }
      if ((((k1->value_).gc)->tt & 0xf) != 4) {
        __assert_fail("(((((k1)->value_).gc)->tt) & 0x0F) == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x97,"int equalkey(const TValue *, const Node *)");
      }
      if ((((n2->i_key).nk.value_.gc)->tt & 0xf) != 4) {
        __assert_fail("(((((n2)->i_key.nk.value_).gc)->tt) & 0x0F) == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x97,"int equalkey(const TValue *, const Node *)");
      }
      k1_local._4_4_ = luaS_eqlngstr((TString *)(k1->value_).gc,(TString *)(n2->i_key).nk.value_.gc)
      ;
      break;
    case 0x16:
      if (k1->tt_ != 0x16) {
        __assert_fail("((((k1))->tt_) == (((6) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x95,"int equalkey(const TValue *, const Node *)");
      }
      k1_local._4_4_ = (uint)((k1->value_).gc == (n2->i_key).nk.value_.gc);
    }
  }
  else {
    k1_local._4_4_ = 0;
  }
  return k1_local._4_4_;
}

Assistant:

static int equalkey (const TValue *k1, const Node *n2) {
  if (rttype(k1) != keytt(n2))  /* not the same variants? */
   return 0;  /* cannot be same key */
  switch (ttype(k1)) {
    case LUA_TNIL:
      return 1;
    case LUA_TBOOLEAN:
      return (bvalue(k1) == keybval(n2));
    case LUA_TNUMINT:
      return (ivalue(k1) == keyival(n2));
    case LUA_TNUMFLT:
      return luai_numeq(fltvalue(k1), keyfltval(n2));
    case RAVI_TFCF:
    case LUA_TLIGHTUSERDATA:
      return pvalue(k1) == keypval(n2);
    case LUA_TLCF:
      return fvalue(k1) == keyfval(n2);
    case LUA_TLNGSTR:
      return luaS_eqlngstr(tsvalue(k1), keystrval(n2));
    default:
      return gcvalue(k1) == keygcval(n2);
  }
}